

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O2

bool tinyusdz::tydra::DefaultTextureImageLoaderFunction
               (AssetPath *assetPath,AssetInfo *assetInfo,AssetResolutionResolver *assetResolver,
               TextureImage *texImageOut,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *imageData,void *userdata,
               string *warn,string *err)

{
  int iVar1;
  bool bVar2;
  ComponentType CVar3;
  value_type *pvVar4;
  error_type *__rhs;
  TextureImage *args;
  Asset *asset_out;
  PixelFormat fmt;
  tinyusdz *this;
  char *__lhs;
  Asset asset;
  expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  TextureImage local_1d0;
  Asset local_180;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  
  if ((texImageOut == (TextureImage *)0x0) ||
     (imageData == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0)) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::assign((char *)err);
    }
    return false;
  }
  args = texImageOut;
  AssetResolutionResolver::resolve(&local_210,assetResolver,(string *)assetPath);
  if (local_210._M_string_length == 0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::string
                ((string *)&local_180,"Failed to resolve asset path: {}\n",(allocator *)&local_1d0);
      tinyusdz::fmt::format<std::__cxx11::string>
                ((string *)&local_c8,(fmt *)&local_180,&assetPath->asset_path_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    bVar2 = false;
    goto LAB_0029c086;
  }
  local_180.version_._M_dataplus._M_p = (pointer)&local_180.version_.field_2;
  local_180.version_._M_string_length = 0;
  local_180.version_.field_2._M_local_buf[0] = '\0';
  local_180.name_._M_dataplus._M_p = (pointer)&local_180.name_.field_2;
  local_180.name_._M_string_length = 0;
  local_180.name_.field_2._M_local_buf[0] = '\0';
  local_180.resolved_name_._M_dataplus._M_p = (pointer)&local_180.resolved_name_.field_2;
  local_180.resolved_name_._M_string_length = 0;
  local_180.resolved_name_.field_2._M_local_buf[0] = '\0';
  local_180.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_180.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_180.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  asset_out = &local_180;
  bVar2 = AssetResolutionResolver::open_asset
                    (assetResolver,&local_210,(string *)assetPath,asset_out,warn,err);
  if (bVar2) {
    image::LoadImageFromMemory
              (&local_c8,
               local_180.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (long)local_180.buf_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_180.buf_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_210);
    if (local_c8.contained.
        super_storage_t_impl<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value == false) {
      if (err != (string *)0x0) {
        __rhs = nonstd::expected_lite::
                expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::error(&local_c8);
        ::std::operator+(&local_1f0,"Failed to load image file: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
        ;
        ::std::operator+(&local_1d0.asset_identifier,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1f0,"\n");
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      bVar2 = false;
    }
    else {
      local_1d0.asset_identifier._M_dataplus._M_p = (pointer)&local_1d0.asset_identifier.field_2;
      local_1d0.asset_identifier._M_string_length = 0;
      local_1d0.asset_identifier.field_2._M_local_buf[0] = '\0';
      local_1d0.texelComponentType = UInt8;
      local_1d0.assetTexelComponentType = UInt8;
      local_1d0.colorSpace = sRGB;
      local_1d0.usdColorSpace = sRGB;
      local_1d0.width = -1;
      local_1d0.height = -1;
      local_1d0.channels = -1;
      local_1d0.miplevel = 0;
      local_1d0.buffer_id = -1;
      local_1d0.handle = 0;
      ::std::__cxx11::string::_M_assign((string *)&local_1d0);
      pvVar4 = nonstd::expected_lite::
               expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value(&local_c8);
      local_1d0.channels = (pvVar4->image).channels;
      pvVar4 = nonstd::expected_lite::
               expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value(&local_c8);
      iVar1 = (pvVar4->image).bpp;
      if (iVar1 == 8) {
        CVar3 = UInt8;
LAB_0029bf65:
        local_1d0.assetTexelComponentType = CVar3;
        pvVar4 = nonstd::expected_lite::
                 expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&local_c8);
        local_1d0.channels = (pvVar4->image).channels;
        pvVar4 = nonstd::expected_lite::
                 expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&local_c8);
        local_1d0.width = (pvVar4->image).width;
        pvVar4 = nonstd::expected_lite::
                 expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&local_c8);
        local_1d0.height = (pvVar4->image).height;
        TextureImage::operator=(texImageOut,&local_1d0);
        pvVar4 = nonstd::expected_lite::
                 expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&local_c8);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (imageData,&(pvVar4->image).data);
        bVar2 = true;
      }
      else {
        if (iVar1 == 0x10) {
          this = (tinyusdz *)(ulong)(pvVar4->image).format;
          if (this < (tinyusdz *)0x3) {
            CVar3 = *(ComponentType *)(&DAT_0048cb5c + (long)this * 4);
            goto LAB_0029bf65;
          }
          if (err != (string *)0x0) {
            tinyusdz::to_string_abi_cxx11_(&local_108,this,fmt);
            __lhs = "Invalid image.pixelformat: ";
            goto LAB_0029c013;
          }
        }
        else if (err != (string *)0x0) {
          pvVar4 = nonstd::expected_lite::
                   expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::value(&local_c8);
          ::std::__cxx11::to_string(&local_108,(pvVar4->image).bpp);
          __lhs = "TODO or unsupported bpp: ";
LAB_0029c013:
          ::std::operator+(&local_e8,__lhs,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_108);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_e8,"\n");
          ::std::__cxx11::string::append((string *)err);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        bVar2 = false;
      }
      ::std::__cxx11::string::_M_dispose();
    }
    nonstd::expected_lite::
    expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~expected(&local_c8);
  }
  else {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::string
                ((string *)&local_1d0,"Failed to open asset: {}",(allocator *)&local_1f0);
      tinyusdz::fmt::format<std::__cxx11::string>
                ((string *)&local_c8,(fmt *)&local_1d0,(string *)&local_210,&asset_out->version_);
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    bVar2 = false;
  }
  Asset::~Asset(&local_180);
LAB_0029c086:
  ::std::__cxx11::string::_M_dispose();
  return bVar2;
}

Assistant:

bool DefaultTextureImageLoaderFunction(
    const value::AssetPath &assetPath, const AssetInfo &assetInfo,
    const AssetResolutionResolver &assetResolver, TextureImage *texImageOut,
    std::vector<uint8_t> *imageData, void *userdata, std::string *warn,
    std::string *err) {
  if (!texImageOut) {
    if (err) {
      (*err) = "`imageOut` argument is nullptr\n";
    }
    return false;
  }

  if (!imageData) {
    if (err) {
      (*err) = "`imageData` argument is nullptr\n";
    }
    return false;
  }

  // TODO: assetInfo
  (void)assetInfo;
  (void)userdata;
  (void)warn;

  std::string resolvedPath = assetResolver.resolve(assetPath.GetAssetPath());

  if (resolvedPath.empty()) {
    if (err) {
      (*err) += fmt::format("Failed to resolve asset path: {}\n",
                            assetPath.GetAssetPath());
    }
    return false;
  }

  Asset asset;
  bool ret = assetResolver.open_asset(resolvedPath, assetPath.GetAssetPath(),
                                      &asset, warn, err);
  if (!ret) {
    if (err) {
      (*err) += fmt::format("Failed to open asset: {}", resolvedPath);
    }
    return false;
  }

  DCOUT("Resolved asset path = " << resolvedPath);

  // TODO: user-defined image loader handler.
  auto result = tinyusdz::image::LoadImageFromMemory(asset.data(), asset.size(),
                                                     resolvedPath);
  if (!result) {
    if (err) {
      (*err) += "Failed to load image file: " + result.error() + "\n";
    }
    return false;
  }

  TextureImage texImage;

  texImage.asset_identifier = resolvedPath;
  texImage.channels = result.value().image.channels;

  const auto &imgret = result.value();

  if (imgret.image.bpp == 8) {
    // assume uint8
    texImage.assetTexelComponentType = ComponentType::UInt8;
  } else if (imgret.image.bpp == 16) {
    if (imgret.image.format == Image::PixelFormat::UInt) {
      texImage.assetTexelComponentType = ComponentType::UInt16;
    } else if (imgret.image.format == Image::PixelFormat::Int) {
      texImage.assetTexelComponentType = ComponentType::Int16;
    } else if (imgret.image.format == Image::PixelFormat::Float) {
      texImage.assetTexelComponentType = ComponentType::Half;
    } else {
      if (err) {
        (*err) += "Invalid image.pixelformat: " + tinyusdz::to_string(imgret.image.format) + "\n";
      }
      return false;
    }

  } else if (imgret.image.bpp == 16) {
    if (imgret.image.format == Image::PixelFormat::UInt) {
      texImage.assetTexelComponentType = ComponentType::UInt32;
    } else if (imgret.image.format == Image::PixelFormat::Int) {
      texImage.assetTexelComponentType = ComponentType::Int32;
    } else if (imgret.image.format == Image::PixelFormat::Float) {
      texImage.assetTexelComponentType = ComponentType::Float;
    } else {
      if (err) {
        (*err) += "Invalid image.pixelformat: " + tinyusdz::to_string(imgret.image.format) + "\n";
      }
      return false;
    }
  } else {
    DCOUT("TODO: bpp = " << result.value().image.bpp);
    if (err) {
      (*err) += "TODO or unsupported bpp: " +
               std::to_string(result.value().image.bpp) + "\n";
    }
    return false;
  }

  texImage.channels = result.value().image.channels;
  texImage.width = result.value().image.width;
  texImage.height = result.value().image.height;

  (*texImageOut) = texImage;

  // raw image data
  (*imageData) = result.value().image.data;

  return true;
}